

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O0

void __thiscall
correctness_small_fuzzing_a_z_Test::correctness_small_fuzzing_a_z_Test
          (correctness_small_fuzzing_a_z_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__correctness_small_fuzzing_a_z_Test_0016e8a8;
  return;
}

Assistant:

TEST(correctness, small_fuzzing_a_z) {
    srand(0);
    for (int i = 0; i < 100; ++i) {
        std::string input;
        for (int j = 0; j < 100; ++j) {
            input += ('a' + static_cast<unsigned char>(rand() % 26));
        }
        check_eq(input);
    }
}